

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void extendResult(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *result,vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          *contents)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  cmGeneratorExpressionEvaluator *pcVar2;
  int iVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  
  ppcVar6 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((result->
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      )._M_impl.super__Vector_impl_data._M_start != ppcVar6) {
    iVar3 = (*ppcVar6[-1]->_vptr_cmGeneratorExpressionEvaluator[2])();
    if (iVar3 == 0) {
      iVar3 = (*(*(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_vptr_cmGeneratorExpressionEvaluator
                [2])();
      if (iVar3 == 0) {
        pcVar2 = *(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (result->
                 super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1] + 2;
        pcVar1->_vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)
             ((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator +
             (long)pcVar2[2]._vptr_cmGeneratorExpressionEvaluator);
        if (pcVar2 != (cmGeneratorExpressionEvaluator *)0x0) {
          (*pcVar2->_vptr_cmGeneratorExpressionEvaluator[1])();
        }
        ppcVar6 = (result->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppcVar4 = (contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppcVar5 = (contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_0032c823;
      }
    }
  }
  ppcVar6 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppcVar5 = (contents->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppcVar4 = (contents->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
LAB_0032c823:
  std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>
            ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
              *)result,ppcVar6,ppcVar5,ppcVar4);
  return;
}

Assistant:

static void extendResult(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  const std::vector<cmGeneratorExpressionEvaluator*>& contents)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text &&
      contents.front()->GetType() == cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(
      static_cast<TextContent*>(contents.front())->GetLength());
    delete contents.front();
    result.insert(result.end(), contents.begin() + 1, contents.end());
  } else {
    result.insert(result.end(), contents.begin(), contents.end());
  }
}